

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O2

char * __thiscall
google::protobuf::internal::UnknownFieldLiteParserHelper::ParseGroup
          (UnknownFieldLiteParserHelper *this,uint32_t num,char *ptr,ParseContext *ctx)

{
  char *pcVar1;
  uint tag;
  
  tag = num * 8 + 3;
  if (this->unknown_ != (string *)0x0) {
    WriteVarint((ulong)tag,this->unknown_);
  }
  pcVar1 = ParseContext::ParseGroup<google::protobuf::internal::UnknownFieldLiteParserHelper>
                     (ctx,this,ptr,tag);
  if ((pcVar1 != (char *)0x0) && (this->unknown_ != (string *)0x0)) {
    WriteVarint((ulong)(num << 3 | 4),this->unknown_);
  }
  return pcVar1;
}

Assistant:

const char* ParseGroup(uint32_t num, const char* ptr, ParseContext* ctx) {
    if (unknown_) WriteVarint(num * 8 + 3, unknown_);
    ptr = ctx->ParseGroup(this, ptr, num * 8 + 3);
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    if (unknown_) WriteVarint(num * 8 + 4, unknown_);
    return ptr;
  }